

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

void __thiscall avro::NodeSymbolic::printJson(NodeSymbolic *this,ostream *os,int depth)

{
  ostream *poVar1;
  string local_38;
  
  local_38._M_dataplus._M_p._0_1_ = 0x22;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_38,1);
  Name::fullname_abi_cxx11_(&local_38,&(this->super_NodeImplSymbolic).nameAttribute_.attr_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                              local_38._M_dataplus._M_p._0_1_),
                      local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p._0_1_ = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_38,1);
  return;
}

Assistant:

void 
NodeSymbolic::printJson(std::ostream &os, int depth) const
{
    os << '\"' << nameAttribute_.get() << '\"';
}